

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int noise_state_init(aom_noise_state_t *state,int n,int bit_depth)

{
  int iVar1;
  
  iVar1 = equation_system_init(&state->eqns,n);
  if (iVar1 != 0) {
    state->ar_gain = 1.0;
    state->num_observations = 0;
    iVar1 = aom_noise_strength_solver_init(&state->strength_solver,0x14,bit_depth);
    return iVar1;
  }
  fprintf(_stderr,"Failed initialization noise state with size %d\n",n);
  return 0;
}

Assistant:

static int noise_state_init(aom_noise_state_t *state, int n, int bit_depth) {
  const int kNumBins = 20;
  if (!equation_system_init(&state->eqns, n)) {
    fprintf(stderr, "Failed initialization noise state with size %d\n", n);
    return 0;
  }
  state->ar_gain = 1.0;
  state->num_observations = 0;
  return aom_noise_strength_solver_init(&state->strength_solver, kNumBins,
                                        bit_depth);
}